

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O0

void __thiscall
vigra::colormap<unsigned_int,_unsigned_char>::colormap
          (colormap<unsigned_int,_unsigned_char> *this,uint numTableElements,uint numTables,
          uint numTableBands)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  size_type in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  void_vector<unsigned_char>::void_vector
            ((void_vector<unsigned_char> *)(in_RDI + 4),in_stack_ffffffffffffffc8);
  throw_precondition_error
            (SUB41((uint)in_ESI >> 0x18,0),(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

colormap( const unsigned int numTableElements,
                  const unsigned int numTables,
                  const unsigned int numTableBands )
            : m_numTableElements(numTableElements),
              m_numTables(numTables), m_numTableBands(numTableBands),
              m_tables( numTableElements * numTableBands )
        {
            vigra_precondition( ( numTables == 1 ) || ( numTableBands == 1 ),
                                "numTables or numTableBands must be 1" );
        }